

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async-test.c++
# Opt level: O1

void __thiscall kj::anon_unknown_0::TestCase435::run(TestCase435 *this)

{
  PromiseNode *pPVar1;
  __pid_t _Var2;
  TransformPromiseNodeBase *pTVar3;
  EventLoop *pEVar4;
  ForkedPromise<int> fork;
  PromiseForResult<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_Cosmic_Sans[P]capnproto_c___src_kj_async_test_c__:447:40),_int>
  branch2;
  PromiseForResult<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_Cosmic_Sans[P]capnproto_c___src_kj_async_test_c__:443:40),_int>
  branch1;
  Promise<int> promise;
  WaitScope waitScope;
  EventLoop loop;
  Own<kj::_::PromiseNode> local_b0;
  undefined1 local_a0 [8];
  TransformPromiseNodeBase *local_98;
  undefined1 local_90 [8];
  EventLoop *local_88;
  Promise<int> local_80;
  Event *local_70;
  TransformPromiseNodeBase *local_68;
  EventLoop *local_60;
  undefined4 local_58;
  __pid_t local_4c;
  EventLoop local_48;
  
  EventLoop::EventLoop(&local_48);
  local_58 = 0xffffffff;
  local_60 = &local_48;
  EventLoop::enterScope(&local_48);
  _::yield();
  pTVar3 = (TransformPromiseNodeBase *)operator_new(0x28);
  _::TransformPromiseNodeBase::TransformPromiseNodeBase
            (pTVar3,&local_b0,
             _::
             TransformPromiseNode<int,_kj::_::Void,_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/async-test.c++:439:36),_kj::_::PropagateException>
             ::anon_class_1_0_00000001_for_func::operator());
  pPVar1 = local_b0.ptr;
  (pTVar3->super_PromiseNode)._vptr_PromiseNode = (_func_int **)&PTR_onReady_00452120;
  local_70 = (Event *)&_::
                       HeapDisposer<kj::_::TransformPromiseNode<int,kj::_::Void,kj::(anonymous_namespace)::TestCase435::run()::$_0,kj::_::PropagateException>>
                       ::instance;
  local_68 = pTVar3;
  if (local_b0.ptr != (PromiseNode *)0x0) {
    local_b0.ptr = (PromiseNode *)0x0;
    (**(local_b0.disposer)->_vptr_Disposer)
              (local_b0.disposer,pPVar1->_vptr_PromiseNode[-2] + (long)&pPVar1->_vptr_PromiseNode);
  }
  Promise<int>::fork((Promise<int> *)&local_b0);
  _::ForkHub<int>::addBranch((ForkHub<int> *)local_a0);
  pEVar4 = (EventLoop *)operator_new(0x28);
  _::TransformPromiseNodeBase::TransformPromiseNodeBase
            ((TransformPromiseNodeBase *)pEVar4,(Own<kj::_::PromiseNode> *)local_a0,
             _::
             TransformPromiseNode<int,_int,_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/async-test.c++:443:40),_kj::_::PropagateException>
             ::anon_class_1_0_00000001_for_func::operator());
  pTVar3 = local_98;
  ((PromiseNode *)&pEVar4->port)->_vptr_PromiseNode = (_func_int **)&PTR_onReady_004521a8;
  local_80.super_PromiseBase.node.disposer =
       (Disposer *)
       &_::
        HeapDisposer<kj::_::TransformPromiseNode<int,int,kj::(anonymous_namespace)::TestCase435::run()::$_1,kj::_::PropagateException>>
        ::instance;
  local_80.super_PromiseBase.node.ptr = (PromiseNode *)pEVar4;
  if (local_98 != (TransformPromiseNodeBase *)0x0) {
    local_98 = (TransformPromiseNodeBase *)0x0;
    (**(code **)*(_func_int **)local_a0)
              (local_a0,(pTVar3->super_PromiseNode)._vptr_PromiseNode[-2] +
                        (long)&pTVar3->super_PromiseNode);
  }
  _::ForkHub<int>::addBranch((ForkHub<int> *)local_90);
  pTVar3 = (TransformPromiseNodeBase *)operator_new(0x28);
  _::TransformPromiseNodeBase::TransformPromiseNodeBase
            (pTVar3,(Own<kj::_::PromiseNode> *)local_90,
             _::
             TransformPromiseNode<int,_int,_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/async-test.c++:447:40),_kj::_::PropagateException>
             ::anon_class_1_0_00000001_for_func::operator());
  pEVar4 = local_88;
  (pTVar3->super_PromiseNode)._vptr_PromiseNode = (_func_int **)&PTR_onReady_00452230;
  local_a0 = (undefined1  [8])
             &_::
              HeapDisposer<kj::_::TransformPromiseNode<int,int,kj::(anonymous_namespace)::TestCase435::run()::$_2,kj::_::PropagateException>>
              ::instance;
  local_98 = pTVar3;
  if (local_88 != (EventLoop *)0x0) {
    local_88 = (EventLoop *)0x0;
    (*(code *)**(undefined8 **)CONCAT44(local_90._4_4_,local_90._0_4_))
              ((undefined8 *)CONCAT44(local_90._4_4_,local_90._0_4_),
               (long)&pEVar4->port + (long)pEVar4->port[-2]._vptr_EventPort);
  }
  pPVar1 = local_b0.ptr;
  local_b0.ptr = (PromiseNode *)0x0;
  if (pPVar1 != (PromiseNode *)0x0) {
    (**(local_b0.disposer)->_vptr_Disposer)
              (local_b0.disposer,pPVar1->_vptr_PromiseNode[-2] + (long)&pPVar1->_vptr_PromiseNode);
  }
  _Var2 = Promise<int>::wait(&local_80,&local_60);
  if ((_Var2 != 0x1c8) && (_::Debug::minSeverity < 3)) {
    local_90._0_4_ = 0x1c8;
    local_4c = Promise<int>::wait(&local_80,&local_60);
    _::Debug::log<char_const(&)[52],int,int>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/async-test.c++"
               ,0x1c8,ERROR,
               "\"failed: expected \" \"(456) == (branch1.wait(waitScope))\", 456, branch1.wait(waitScope)"
               ,(char (*) [52])"failed: expected (456) == (branch1.wait(waitScope))",(int *)local_90
               ,&local_4c);
  }
  _Var2 = Promise<int>::wait((Promise<int> *)local_a0,&local_60);
  if ((_Var2 != 0x315) && (_::Debug::minSeverity < 3)) {
    local_90._0_4_ = 0x315;
    local_4c = Promise<int>::wait((Promise<int> *)local_a0,&local_60);
    _::Debug::log<char_const(&)[52],int,int>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/async-test.c++"
               ,0x1c9,ERROR,
               "\"failed: expected \" \"(789) == (branch2.wait(waitScope))\", 789, branch2.wait(waitScope)"
               ,(char (*) [52])"failed: expected (789) == (branch2.wait(waitScope))",(int *)local_90
               ,&local_4c);
  }
  pTVar3 = local_98;
  if (local_98 != (TransformPromiseNodeBase *)0x0) {
    local_98 = (TransformPromiseNodeBase *)0x0;
    (**(code **)*(_func_int **)local_a0)
              (local_a0,(pTVar3->super_PromiseNode)._vptr_PromiseNode[-2] +
                        (long)&(pTVar3->super_PromiseNode)._vptr_PromiseNode);
  }
  pPVar1 = local_80.super_PromiseBase.node.ptr;
  if ((EventLoop *)local_80.super_PromiseBase.node.ptr != (EventLoop *)0x0) {
    local_80.super_PromiseBase.node.ptr = (PromiseNode *)0x0;
    (**(local_80.super_PromiseBase.node.disposer)->_vptr_Disposer)
              (local_80.super_PromiseBase.node.disposer,
               ((PromiseNode *)&pPVar1->_vptr_PromiseNode)->_vptr_PromiseNode[-2] +
               (long)&((PromiseNode *)&pPVar1->_vptr_PromiseNode)->_vptr_PromiseNode);
  }
  pPVar1 = local_b0.ptr;
  if (local_b0.ptr != (PromiseNode *)0x0) {
    local_b0.ptr = (PromiseNode *)0x0;
    (**(local_b0.disposer)->_vptr_Disposer)
              (local_b0.disposer,pPVar1->_vptr_PromiseNode[-2] + (long)&pPVar1->_vptr_PromiseNode);
  }
  pTVar3 = local_68;
  if (local_68 != (TransformPromiseNodeBase *)0x0) {
    local_68 = (TransformPromiseNodeBase *)0x0;
    (**local_70->_vptr_Event)
              (local_70,(pTVar3->super_PromiseNode)._vptr_PromiseNode[-2] +
                        (long)&(pTVar3->super_PromiseNode)._vptr_PromiseNode);
  }
  EventLoop::leaveScope(local_60);
  EventLoop::~EventLoop(&local_48);
  return;
}

Assistant:

TEST(Async, Fork) {
  EventLoop loop;
  WaitScope waitScope(loop);

  Promise<int> promise = evalLater([&]() { return 123; });

  auto fork = promise.fork();

  auto branch1 = fork.addBranch().then([](int i) {
    EXPECT_EQ(123, i);
    return 456;
  });
  auto branch2 = fork.addBranch().then([](int i) {
    EXPECT_EQ(123, i);
    return 789;
  });

  {
    auto releaseFork = kj::mv(fork);
  }

  EXPECT_EQ(456, branch1.wait(waitScope));
  EXPECT_EQ(789, branch2.wait(waitScope));
}